

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::
AssignPointsToCorners
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder> *this,
          int num_connectivity_verts)

{
  pointer pAVar1;
  uint uVar2;
  CornerTable *pCVar3;
  MeshEdgebreakerDecoder *pMVar4;
  int c;
  uint uVar5;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar6;
  ulong uVar7;
  long lVar8;
  undefined4 uVar9;
  ulong uVar10;
  FaceIndex FVar11;
  long lVar12;
  ulong uVar13;
  Mesh *pMVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar20;
  bool bVar21;
  vector<int,_std::allocator<int>_> point_to_corner_map;
  Face face_1;
  vector<int,_std::allocator<int>_> corner_to_point_map;
  vector<int,_std::allocator<int>_> local_78;
  Face local_58;
  vector<int,_std::allocator<int>_> local_48;
  
  pCVar3 = (this->corner_table_)._M_t.
           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>._M_t.
           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
           super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffff00000000);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  std::
  vector<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
  ::resize(&(((this->decoder_->super_MeshDecoder).mesh_)->faces_).vector_,
           (long)(int)((ulong)((long)*(pointer *)
                                      ((long)&(pCVar3->corner_to_vertex_map_).vector_ + 8) -
                               *(long *)&(pCVar3->corner_to_vertex_map_).vector_ >> 2) / 3),
           (value_type *)&local_78);
  if ((this->attribute_data_).
      super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->attribute_data_).
      super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pMVar4 = this->decoder_;
    pMVar14 = (pMVar4->super_MeshDecoder).mesh_;
    if ((int)((ulong)((long)(pMVar14->faces_).vector_.
                            super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pMVar14->faces_).vector_.
                           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 != 0) {
      lVar12 = 0;
      FVar11.value_ = 0;
      do {
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((ulong)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish & 0xffffffff00000000);
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        pCVar3 = (this->corner_table_)._M_t.
                 super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                 .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
        lVar8 = 0;
        do {
          if ((int)(lVar12 + lVar8) == -1) {
            uVar9 = 0xffffffff;
          }
          else {
            uVar9 = *(undefined4 *)
                     (*(long *)&(pCVar3->corner_to_vertex_map_).vector_ +
                     (lVar12 + lVar8 & 0xffffffffU) * 4);
          }
          *(undefined4 *)
           ((long)&local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar8 * 4) = uVar9;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        Mesh::SetFace(pMVar14,FVar11,(Face *)&local_78);
        FVar11.value_ = FVar11.value_ + 1;
        pMVar4 = this->decoder_;
        pMVar14 = (pMVar4->super_MeshDecoder).mesh_;
        lVar12 = lVar12 + 3;
      } while (FVar11.value_ <
               (uint)((int)((ulong)((long)(pMVar14->faces_).vector_.
                                          super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pMVar14->faces_).vector_.
                                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     -0x55555555));
    }
    ((pMVar4->super_MeshDecoder).super_PointCloudDecoder.point_cloud_)->num_points_ =
         num_connectivity_verts;
    bVar21 = true;
  }
  else {
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    pCVar3 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_48,
               (long)(int)((ulong)((long)*(pointer *)
                                          ((long)&(pCVar3->corner_to_vertex_map_).vector_ + 8) -
                                  *(long *)&(pCVar3->corner_to_vertex_map_).vector_) >> 2),
               (allocator_type *)&local_58);
    pCVar3 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    lVar12 = *(long *)&(pCVar3->vertex_corners_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ;
    if (0 < (int)((ulong)((long)*(pointer *)((long)&(pCVar3->vertex_corners_).vector_ + 8) - lVar12)
                 >> 2)) {
      uVar19 = 0;
      do {
        uVar5 = *(uint *)(lVar12 + uVar19 * 4);
        uVar7 = (ulong)uVar5;
        if (uVar7 != 0xffffffff) {
          uVar16 = uVar7;
          if (((this->is_vert_hole_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [uVar19 >> 6 & 0x3ffffff] >> (uVar19 & 0x3f) & 1) == 0) {
            pAVar1 = (this->attribute_data_).
                     super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar12 = (long)(this->attribute_data_).
                           super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
            if (lVar12 != 0) {
              uVar10 = (lVar12 >> 6) * -0x3333333333333333;
              bVar21 = uVar5 * -0x55555555 < 0x55555556;
              uVar2 = uVar5 - 1;
              if (bVar21) {
                uVar2 = uVar5 + 2;
              }
              uVar13 = 0;
              do {
                uVar18 = *(uint *)(*(long *)&((pAVar1[uVar13].connectivity_data.corner_table_)->
                                             corner_to_vertex_map_).vector_.
                                             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                  + uVar7 * 4);
                if ((*(ulong *)(*(long *)&pAVar1[uVar13].connectivity_data.is_vertex_on_seam_.
                                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                                          super__Bvector_impl_data + (ulong)(uVar18 >> 6) * 8) >>
                     ((ulong)uVar18 & 0x3f) & 1) != 0) {
                  uVar16 = 0xffffffff;
                  if ((!bVar21 || uVar5 + 2 != 0xffffffff) &&
                     (iVar15 = *(int *)(*(long *)&(pCVar3->opposite_corners_).vector_.
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                                  ._M_impl + (ulong)uVar2 * 4), iVar15 != -1)) {
                    if ((uint)(iVar15 * -0x55555555) < 0x55555556) {
                      uVar18 = iVar15 + 2;
                    }
                    else {
                      uVar18 = iVar15 - 1;
                    }
                    uVar16 = (ulong)uVar18;
                  }
                  if ((uint)uVar16 != uVar5) {
                    lVar12 = *(long *)&pAVar1[uVar13].connectivity_data.corner_to_vertex_map_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data;
                    do {
                      iVar15 = (int)uVar16;
                      if (iVar15 == -1) {
                        bVar21 = false;
                        goto LAB_0012d49c;
                      }
                      if (*(int *)(lVar12 + uVar16 * 4) != *(int *)(lVar12 + uVar7 * 4))
                      goto LAB_0012d029;
                      if ((uint)(iVar15 * -0x55555555) < 0x55555556) {
                        uVar18 = iVar15 + 2;
                        if (uVar18 != 0xffffffff) goto LAB_0012d15b;
LAB_0012d181:
                        uVar16 = 0xffffffff;
                      }
                      else {
                        uVar18 = iVar15 - 1;
LAB_0012d15b:
                        iVar15 = *(int *)(*(long *)&(pCVar3->opposite_corners_).vector_.
                                                                                                        
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                                  ._M_impl + (ulong)uVar18 * 4);
                        if (iVar15 == -1) goto LAB_0012d181;
                        if ((uint)(iVar15 * -0x55555555) < 0x55555556) {
                          uVar16 = (ulong)(iVar15 + 2);
                        }
                        else {
                          uVar16 = (ulong)(iVar15 - 1);
                        }
                      }
                    } while ((uint)uVar16 != uVar5);
                  }
                }
                uVar13 = (ulong)((int)uVar13 + 1);
                uVar16 = uVar7;
              } while (uVar13 <= uVar10 && uVar10 - uVar13 != 0);
            }
          }
LAB_0012d029:
          IVar20.value_ = (uint)uVar16;
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar16] =
               (int)((ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
          local_58._M_elems[0].value_ = IVar20.value_;
          if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_58);
            pCVar3 = (this->corner_table_)._M_t.
                     super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                     .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
          }
          else {
            *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = IVar20.value_;
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          if (IVar20.value_ != 0xffffffff) {
            if (IVar20.value_ * -0x55555555 < 0x55555556) {
              uVar5 = IVar20.value_ + 2;
              if (uVar5 == 0xffffffff) goto LAB_0012d317;
            }
            else {
              uVar5 = IVar20.value_ - 1;
            }
            iVar15 = *(int *)((long)(pCVar3->opposite_corners_).vector_.
                                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + (ulong)uVar5 * 4);
            if (((iVar15 != -1) &&
                (IVar6.value_ = (((uint)(iVar15 * -0x55555555) < 0x55555556) - 1 | 2) + iVar15,
                IVar6.value_ != 0xffffffff)) && (IVar6.value_ != IVar20.value_)) {
              do {
                uVar10 = (ulong)IVar6.value_;
                pAVar1 = (this->attribute_data_).
                         super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar7 = (ulong)IVar6.value_;
                lVar12 = (long)(this->attribute_data_).
                               super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
                if (lVar12 != 0) {
                  uVar13 = (lVar12 >> 6) * -0x3333333333333333;
                  uVar5 = 1;
                  uVar17 = 0;
                  do {
                    lVar12 = *(long *)&pAVar1[uVar17].connectivity_data.corner_to_vertex_map_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                       ._M_impl;
                    if (*(int *)(lVar12 + uVar7 * 4) != *(int *)(lVar12 + uVar16 * 4)) {
                      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7] =
                           (int)((ulong)((long)local_78.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 2);
                      local_58._M_elems[0].value_ = IVar6.value_;
                      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                  (&local_78,
                                   (iterator)
                                   local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish,(int *)&local_58);
                      }
                      else {
                        *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = IVar6.value_;
                        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1;
                      }
                      pCVar3 = (this->corner_table_)._M_t.
                               super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                               .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
                      goto LAB_0012d2be;
                    }
                    uVar17 = (ulong)uVar5;
                    uVar5 = uVar5 + 1;
                  } while (uVar17 <= uVar13 && uVar13 - uVar17 != 0);
                }
                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7] =
                     local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16];
LAB_0012d2be:
                if (IVar6.value_ == 0xffffffff) break;
                if (IVar6.value_ * -0x55555555 < 0x55555556) {
                  uVar5 = IVar6.value_ + 2;
                  if (uVar5 == 0xffffffff) break;
                }
                else {
                  uVar5 = IVar6.value_ - 1;
                }
                iVar15 = *(int *)(*(long *)&(pCVar3->opposite_corners_).vector_.
                                            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                            ._M_impl.super__Vector_impl_data + (ulong)uVar5 * 4);
                if (((iVar15 == -1) ||
                    (IVar6.value_ = (((uint)(iVar15 * -0x55555555) < 0x55555556) - 1 | 2) + iVar15,
                    IVar6.value_ == 0xffffffff)) || (uVar16 = uVar10, IVar6.value_ == IVar20.value_)
                   ) break;
              } while( true );
            }
          }
        }
LAB_0012d317:
        uVar19 = uVar19 + 1;
        lVar12 = *(long *)&(pCVar3->vertex_corners_).vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data;
      } while ((long)uVar19 <
               (long)(int)((ulong)((long)*(pointer *)
                                          ((long)&(pCVar3->vertex_corners_).vector_.
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                                  ._M_impl + 8) - lVar12) >> 2));
    }
    pMVar4 = this->decoder_;
    pMVar14 = (pMVar4->super_MeshDecoder).mesh_;
    if ((int)((ulong)((long)(pMVar14->faces_).vector_.
                            super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pMVar14->faces_).vector_.
                           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 != 0) {
      iVar15 = 0;
      FVar11.value_ = 0;
      do {
        local_58._M_elems[2].value_ = 0;
        local_58._M_elems[0].value_ = 0;
        local_58._M_elems[1].value_ = 0;
        lVar12 = 0;
        do {
          local_58._M_elems[lVar12].value_ =
               local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(uint)(iVar15 + (int)lVar12)];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        Mesh::SetFace(pMVar14,FVar11,&local_58);
        FVar11.value_ = FVar11.value_ + 1;
        pMVar4 = this->decoder_;
        pMVar14 = (pMVar4->super_MeshDecoder).mesh_;
        iVar15 = iVar15 + 3;
      } while (FVar11.value_ <
               (uint)((int)((ulong)((long)(pMVar14->faces_).vector_.
                                          super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pMVar14->faces_).vector_.
                                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     -0x55555555));
    }
    ((pMVar4->super_MeshDecoder).super_PointCloudDecoder.point_cloud_)->num_points_ =
         (ValueType)
         ((ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2);
    bVar21 = true;
LAB_0012d49c:
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return bVar21;
}

Assistant:

bool MeshEdgebreakerDecoderImpl<TraversalDecoder>::AssignPointsToCorners(
    int num_connectivity_verts) {
  // Map between the existing and deduplicated point ids.
  // Note that at this point we have one point id for each corner of the
  // mesh so there is corner_table_->num_corners() point ids.
  decoder_->mesh()->SetNumFaces(corner_table_->num_faces());

  if (attribute_data_.empty()) {
    // We have connectivity for position only. In this case all vertex indices
    // are equal to point indices.
    for (FaceIndex f(0); f < decoder_->mesh()->num_faces(); ++f) {
      Mesh::Face face;
      const CornerIndex start_corner(3 * f.value());
      for (int c = 0; c < 3; ++c) {
        // Get the vertex index on the corner and use it as a point index.
        const int32_t vert_id = corner_table_->Vertex(start_corner + c).value();
        face[c] = vert_id;
      }
      decoder_->mesh()->SetFace(f, face);
    }
    decoder_->point_cloud()->set_num_points(num_connectivity_verts);
    return true;
  }
  // Else we need to deduplicate multiple attributes.

  // Map between point id and an associated corner id. Only one corner for
  // each point is stored. The corners are used to sample the attribute values
  // in the last stage of the deduplication.
  std::vector<int32_t> point_to_corner_map;
  // Map between every corner and their new point ids.
  std::vector<int32_t> corner_to_point_map(corner_table_->num_corners());
  for (int v = 0; v < corner_table_->num_vertices(); ++v) {
    CornerIndex c = corner_table_->LeftMostCorner(VertexIndex(v));
    if (c == kInvalidCornerIndex) {
      continue;  // Isolated vertex.
    }
    CornerIndex deduplication_first_corner = c;
    if (is_vert_hole_[v]) {
      // If the vertex is on a boundary, start deduplication from the left most
      // corner that is guaranteed to lie on the boundary.
      deduplication_first_corner = c;
    } else {
      // If we are not on the boundary we need to find the first seam (of any
      // attribute).
      for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
        if (!attribute_data_[i].connectivity_data.IsCornerOnSeam(c)) {
          continue;  // No seam for this attribute, ignore it.
        }
        // Else there needs to be at least one seam edge.

        // At this point, we use identity mapping between corners and point ids.
        const VertexIndex vert_id =
            attribute_data_[i].connectivity_data.Vertex(c);
        CornerIndex act_c = corner_table_->SwingRight(c);
        bool seam_found = false;
        while (act_c != c) {
          if (act_c == kInvalidCornerIndex) {
            return false;
          }
          if (attribute_data_[i].connectivity_data.Vertex(act_c) != vert_id) {
            // Attribute seam found. Stop.
            deduplication_first_corner = act_c;
            seam_found = true;
            break;
          }
          act_c = corner_table_->SwingRight(act_c);
        }
        if (seam_found) {
          break;  // No reason to process other attributes if we found a seam.
        }
      }
    }

    // Do a deduplication pass over the corners on the processed vertex.
    // At this point each corner corresponds to one point id and our goal is to
    // merge similar points into a single point id.
    // We do a single pass in a clockwise direction over the corners and we add
    // a new point id whenever one of the attributes change.
    c = deduplication_first_corner;
    // Create a new point.
    corner_to_point_map[c.value()] =
        static_cast<uint32_t>(point_to_corner_map.size());
    point_to_corner_map.push_back(c.value());
    // Traverse in CW direction.
    CornerIndex prev_c = c;
    c = corner_table_->SwingRight(c);
    while (c != kInvalidCornerIndex && c != deduplication_first_corner) {
      bool attribute_seam = false;
      for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
        if (attribute_data_[i].connectivity_data.Vertex(c) !=
            attribute_data_[i].connectivity_data.Vertex(prev_c)) {
          // Attribute index changed from the previous corner. We need to add a
          // new point here.
          attribute_seam = true;
          break;
        }
      }
      if (attribute_seam) {
        corner_to_point_map[c.value()] =
            static_cast<uint32_t>(point_to_corner_map.size());
        point_to_corner_map.push_back(c.value());
      } else {
        corner_to_point_map[c.value()] = corner_to_point_map[prev_c.value()];
      }
      prev_c = c;
      c = corner_table_->SwingRight(c);
    }
  }
  // Add faces.
  for (FaceIndex f(0); f < decoder_->mesh()->num_faces(); ++f) {
    Mesh::Face face;
    for (int c = 0; c < 3; ++c) {
      // Remap old points to the new ones.
      face[c] = corner_to_point_map[3 * f.value() + c];
    }
    decoder_->mesh()->SetFace(f, face);
  }
  decoder_->point_cloud()->set_num_points(
      static_cast<uint32_t>(point_to_corner_map.size()));
  return true;
}